

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsObject.c
# Opt level: O0

void JsStandardPut(JsObject *self,char *prop,JsValue *val0,int flags)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  JsValue *val;
  JsValue v;
  JsStandardSelfBlock *sb;
  JsProperty *p;
  int local_28;
  int size;
  int i;
  int flags_local;
  JsValue *val0_local;
  char *prop_local;
  JsObject *self_local;
  
  v.u.reference.name = (char *)*self->sb;
  JsAssert((uint)(val0 != (JsValue *)0x0));
  JsLockup(*(JsLock *)(v.u.reference.name + 0x10));
  (*self->CanPut)(self,prop,(JsValue *)&val);
  if (v.type == JS_UNDEFINED) {
    JsUnlock(*(JsLock *)(v.u.reference.name + 0x10));
  }
  else {
    puVar3 = (undefined8 *)JsMalloc(0x18);
    *puVar3 = *(undefined8 *)val0;
    puVar3[1] = (val0->u).number;
    puVar3[2] = (val0->u).reference.name;
    iVar1 = JsListSize(*(void **)v.u.reference.name);
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      puVar4 = (undefined8 *)JsListGet(*(void **)v.u.reference.name,local_28);
      iVar2 = strcmp((char *)*puVar4,prop);
      if (iVar2 == 0) {
        puVar4[1] = puVar3;
        JsUnlock(*(JsLock *)(v.u.reference.name + 0x10));
        return;
      }
    }
    puVar4 = (undefined8 *)JsMalloc(0x18);
    *puVar4 = prop;
    puVar4[1] = puVar3;
    *(int *)(puVar4 + 2) = flags;
    JsListPush(*(void **)v.u.reference.name,puVar4);
    JsUnlock(*(JsLock *)(v.u.reference.name + 0x10));
  }
  return;
}

Assistant:

void JsStandardPut(struct JsObject *self, char *prop, struct JsValue *val0, int flags){
	int i,size;
	struct JsProperty* p;
	struct JsStandardSelfBlock* sb;
	struct JsValue v;
	sb = (struct JsStandardSelfBlock*)self->sb[JS_STANDARD_OBJECT_FLOOR];
	JsAssert(val0 != NULL);
	JsLockup(sb->lock);
	(*self->CanPut)(self,prop,&v);
	if(v.u.boolean  == FALSE){
		JsUnlock(sb->lock);
		return;
	}
	//拷贝指针指向的内存
	struct JsValue* val = (struct JsValue*)JsMalloc(sizeof(struct JsValue));
	*val = *val0;
	size = JsListSize(sb->propertys);
	for(i=0;i<size;++i){
		p = (struct JsProperty*)JsListGet(sb->propertys,i);
		if(strcmp(p->name,prop) == 0){
			//发现同名属性, 则覆盖value. attr 不修改
			p->value = val;
			JsUnlock(sb->lock);
			return;
		}
	}
	//没有发现该属性, 则新添加一个新的属性
	p = (struct JsProperty*)JsMalloc(sizeof(struct JsProperty));
	p->name = prop;
	p->value = val;
	p->attr = flags;
	JsListPush(sb->propertys,p);
	JsUnlock(sb->lock);
	return;
}